

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.h
# Opt level: O2

Info * __thiscall
prometheus::Family<prometheus::Info>::Add<>(Family<prometheus::Info> *this,Labels *labels)

{
  Info *pIVar1;
  __uniq_ptr_impl<prometheus::Info,_std::default_delete<prometheus::Info>_> local_18;
  
  local_18._M_t.super__Tuple_impl<0UL,_prometheus::Info_*,_std::default_delete<prometheus::Info>_>.
  super__Head_base<0UL,_prometheus::Info_*,_false>._M_head_impl =
       (tuple<prometheus::Info_*,_std::default_delete<prometheus::Info>_>)operator_new(1);
  pIVar1 = Add(this,labels,
               (unique_ptr<prometheus::Info,_std::default_delete<prometheus::Info>_> *)&local_18);
  std::unique_ptr<prometheus::Info,_std::default_delete<prometheus::Info>_>::~unique_ptr
            ((unique_ptr<prometheus::Info,_std::default_delete<prometheus::Info>_> *)&local_18);
  return pIVar1;
}

Assistant:

T& Add(const Labels& labels, Args&&... args) {
    return Add(labels, detail::make_unique<T>(args...));
  }